

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint32 mVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  ma_uint8 *pmVar6;
  uint shift;
  int iVar7;
  ma_int16 *pmVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint j;
  long lVar13;
  bool bVar14;
  ma_uint64 local_1068;
  ma_uint8 sampleData [4096];
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) goto LAB_001499df;
  if (pBufferOut == (ma_int16 *)0x0) {
    mVar4 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
    return mVar4;
  }
  local_1068 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    memset(sampleData,0,0x1000);
    if (pWav->bitsPerSample == 0x10) {
      mVar4 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
      return mVar4;
    }
    mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (mVar3 != 0) {
      uVar1 = pWav->channels;
      uVar5 = (ulong)mVar3 / (ulong)uVar1;
      if (mVar3 < uVar1) {
        return 0;
      }
      if (mVar3 % (uint)uVar1 != 0) {
        return 0;
      }
      uVar2 = (uint)uVar5;
      local_1068 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return local_1068;
        }
        uVar12 = 0x1000 / (ulong)mVar3;
        if (framesToRead < 0x1000 / (ulong)mVar3) {
          uVar12 = framesToRead;
        }
        mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar12,sampleData);
        if (mVar4 == 0) break;
        sVar9 = pWav->channels * mVar4;
        if (0x1000 < sVar9 * uVar5) {
          return local_1068;
        }
        switch(uVar2) {
        case 1:
          ma_dr_wav_u8_to_s16(pBufferOut,sampleData,sVar9);
          break;
        case 2:
          for (lVar13 = 0; sVar9 - lVar13 != 0; lVar13 = lVar13 + 1) {
            pBufferOut[lVar13] = *(ma_int16 *)(sampleData + lVar13 * 2);
          }
          break;
        case 3:
          ma_dr_wav_s24_to_s16(pBufferOut,sampleData,sVar9);
          break;
        case 4:
          ma_dr_wav_s32_to_s16(pBufferOut,(ma_int32 *)sampleData,sVar9);
          break;
        default:
          if (uVar2 < 9) {
            pmVar6 = sampleData;
            pmVar8 = pBufferOut;
            for (sVar10 = 0; sVar10 != sVar9; sVar10 = sVar10 + 1) {
              lVar13 = 0;
              uVar11 = 0;
              uVar12 = uVar5;
              iVar7 = uVar2 * -8 + 0x40;
              while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
                uVar11 = uVar11 | (ulong)pmVar6[lVar13] << ((byte)iVar7 & 0x3f);
                iVar7 = iVar7 + 8;
                lVar13 = lVar13 + 1;
              }
              pmVar6 = pmVar6 + uVar5;
              *pmVar8 = (ma_int16)(uVar11 >> 0x30);
              pmVar8 = pmVar8 + 1;
            }
          }
          else {
            memset(pBufferOut,0,sVar9 * 2);
          }
        }
        pBufferOut = pBufferOut + sVar9;
        framesToRead = framesToRead - mVar4;
        local_1068 = local_1068 + mVar4;
      }
      return local_1068;
    }
    goto LAB_001499df;
  case 2:
    mVar4 = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
    return mVar4;
  case 3:
    memset(sampleData,0,0x1000);
    mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (mVar3 != 0) {
      uVar1 = pWav->channels;
      if (mVar3 < uVar1) {
        return 0;
      }
      if (mVar3 % (uint)uVar1 != 0) {
        return 0;
      }
      iVar7 = (int)((ulong)mVar3 / (ulong)uVar1);
      local_1068 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return local_1068;
        }
        uVar5 = 0x1000 / (ulong)mVar3;
        if (framesToRead < 0x1000 / (ulong)mVar3) {
          uVar5 = framesToRead;
        }
        mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,sampleData);
        if (mVar4 == 0) break;
        sVar9 = pWav->channels * mVar4;
        if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
          return local_1068;
        }
        if (iVar7 == 8) {
          ma_dr_wav_f64_to_s16(pBufferOut,(double *)sampleData,sVar9);
        }
        else if (iVar7 == 4) {
          ma_dr_wav_f32_to_s16(pBufferOut,(float *)sampleData,sVar9);
        }
        else {
          memset(pBufferOut,0,sVar9 * 2);
        }
        pBufferOut = pBufferOut + sVar9;
        framesToRead = framesToRead - mVar4;
        local_1068 = local_1068 + mVar4;
      }
      return local_1068;
    }
LAB_001499df:
    local_1068 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    local_1068 = 0;
    memset(sampleData,0,0x1000);
    mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (mVar3 != 0) {
      uVar1 = pWav->channels;
      local_1068 = 0;
      if ((uVar1 <= mVar3) && (mVar3 % (uint)uVar1 == 0)) {
        local_1068 = 0;
        for (; framesToRead != 0; framesToRead = framesToRead - mVar4) {
          uVar5 = 0x1000 / (ulong)mVar3;
          if (framesToRead < 0x1000 / (ulong)mVar3) {
            uVar5 = framesToRead;
          }
          mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,sampleData);
          if (mVar4 == 0) {
            return local_1068;
          }
          sVar9 = pWav->channels * mVar4;
          if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
            return local_1068;
          }
          ma_dr_wav_alaw_to_s16(pBufferOut,sampleData,sVar9);
          pBufferOut = pBufferOut + sVar9;
          local_1068 = local_1068 + mVar4;
        }
      }
    }
    break;
  case 7:
    local_1068 = 0;
    memset(sampleData,0,0x1000);
    mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (mVar3 != 0) {
      uVar1 = pWav->channels;
      local_1068 = 0;
      if ((uVar1 <= mVar3) && (mVar3 % (uint)uVar1 == 0)) {
        local_1068 = 0;
        for (; framesToRead != 0; framesToRead = framesToRead - mVar4) {
          uVar5 = 0x1000 / (ulong)mVar3;
          if (framesToRead < 0x1000 / (ulong)mVar3) {
            uVar5 = framesToRead;
          }
          mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,sampleData);
          if (mVar4 == 0) {
            return local_1068;
          }
          sVar9 = pWav->channels * mVar4;
          if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
            return local_1068;
          }
          ma_dr_wav_mulaw_to_s16(pBufferOut,sampleData,sVar9);
          pBufferOut = pBufferOut + sVar9;
          local_1068 = local_1068 + mVar4;
        }
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag == 0x11) {
      mVar4 = ma_dr_wav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
      return mVar4;
    }
  }
  return local_1068;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int16) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int16) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }
    return 0;
}